

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O3

void __thiscall
gutil::Parameter::Parameter(Parameter *this,int argc,char **argv,char **pdef,char *creator)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  IOException *this_00;
  size_t sVar5;
  char **ppcVar6;
  char *pcVar7;
  ulong uVar8;
  string s;
  ifstream in;
  string local_2a8;
  string *local_288;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  char *local_268;
  ulong local_260;
  string local_258;
  undefined1 local_238 [28];
  int aiStack_21c [123];
  
  local_278 = &this->def;
  local_288 = &this->creat;
  local_270 = &(this->creat).field_2;
  (this->def).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->def).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->def).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->creat)._M_dataplus._M_p = (pointer)local_270;
  (this->creat)._M_string_length = 0;
  (this->creat).field_2._M_local_buf[0] = '\0';
  local_280 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->allparam;
  p_Var1 = &(this->allparam)._M_t._M_impl.super__Rb_tree_header;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_268 = creator;
  if (1 < argc) {
    local_260 = (ulong)(uint)argc;
    uVar8 = 1;
    do {
      if (*argv[uVar8] == '@') {
        std::ifstream::ifstream
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        local_2a8._M_string_length = 0;
        local_2a8.field_2._M_local_buf[0] = '\0';
        lVar2 = *(long *)(local_238._0_8_ + -0x18);
        *(undefined4 *)((long)aiStack_21c + lVar2) = 1;
        std::ios::clear((int)local_238 + (int)lVar2);
        std::ifstream::open((char *)local_238,(int)argv[uVar8] + _S_app);
        lVar2 = *(long *)(local_238._0_8_ + -0x18);
        if (*(int *)((long)aiStack_21c + lVar2 + 4) != 0) {
          this_00 = (IOException *)__cxa_allocate_exception(0x28);
          pcVar3 = argv[uVar8];
          pcVar7 = pcVar3 + 1;
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          sVar5 = strlen(pcVar7);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,pcVar7,pcVar3 + sVar5 + 1);
          IOException::IOException(this_00,&local_258);
          __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
        }
        do {
          cVar4 = std::ios::widen((char)&local_2a8 + (char)lVar2 + 'p');
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_238,(string *)&local_2a8,cVar4);
          trim(&local_2a8);
          if (local_2a8._M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->list,&local_2a8);
          }
          lVar2 = *(long *)(local_238._0_8_ + -0x18);
        } while (*(int *)((long)aiStack_21c + lVar2 + 4) == 0);
        std::ifstream::close();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        std::ifstream::~ifstream
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
      }
      else {
        std::__cxx11::string::string((string *)local_238,argv[uVar8],(allocator *)&local_2a8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
        if ((anon_unknown_4 *)local_238._0_8_ != (anon_unknown_4 *)(local_238 + 0x10)) {
          operator_delete((void *)local_238._0_8_);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_260);
  }
  pcVar3 = local_268;
  pcVar7 = *pdef;
  if (pcVar7 != (char *)0x0) {
    ppcVar6 = pdef + 1;
    do {
      std::__cxx11::string::string((string *)local_238,pcVar7,(allocator *)&local_2a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_278,(value_type *)local_238);
      anon_unknown_4::getValue
                (&local_2a8,(anon_unknown_4 *)local_238._0_8_,(string *)local_238._8_8_);
      std::__cxx11::string::operator=((string *)local_238,(string *)&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      if (((string *)local_238._8_8_ != (string *)0x0) &&
         (*(anon_unknown_4 *)local_238._0_8_ == (anon_unknown_4)0x2d)) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_280,(value_type *)local_238);
      }
      if ((anon_unknown_4 *)local_238._0_8_ != (anon_unknown_4 *)(local_238 + 0x10)) {
        operator_delete((void *)local_238._0_8_);
      }
      pcVar7 = *ppcVar6;
      ppcVar6 = ppcVar6 + 1;
    } while (pcVar7 != (char *)0x0);
  }
  if (pcVar3 != (char *)0x0) {
    pcVar7 = (char *)(this->creat)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)local_288,0,pcVar7,(ulong)pcVar3);
  }
  this->cparam = 0xffffffffffffffff;
  this->pos = 0;
  return;
}

Assistant:

Parameter::Parameter(int argc, char *argv[], const char *pdef[],
                     const char *creator)
{
  for (int i=1; i<argc; i++)
  {
    if (argv[i][0] == '@')
    {
      std::ifstream in;
      std::string s;

      in.exceptions(std::ios_base::badbit);
      in.open(argv[i]+1);

      if (!in.good())
      {
        throw IOException(argv[i]+1);
      }

      while (in.good())
      {
        getline(in, s);

        trim(s);

        if (s.size() > 0)
        {
          list.push_back(s);
        }
      }

      in.close();
    }
    else
    {
      list.push_back(std::string(argv[i]));
    }
  }

  for (int i=0; pdef[i] != 0; i++)
  {
    std::string s=pdef[i];
    def.push_back(s);

    s=getValue(s);

    if (s.size() > 0 && s[0] == '-')
    {
      allparam.insert(s);
    }
  }

  if (creator != 0)
  {
    creat=creator;
  }

  cparam=-1;
  pos=0;
}